

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O2

const_iterator
mserialize::string_view::search
          (const_iterator first,const_iterator last,const_iterator s_first,const_iterator s_last)

{
  char *pcVar1;
  char *pcVar2;
  const_iterator s_it;
  char *pcVar3;
  
  pcVar3 = s_first;
  pcVar1 = first;
  while ((pcVar2 = pcVar1, pcVar3 != s_last && (pcVar2 = last, first != last))) {
    if (*first == *pcVar3) {
      first = first + 1;
      pcVar3 = pcVar3 + 1;
    }
    else {
      first = pcVar1 + 1;
      pcVar3 = s_first;
      pcVar1 = first;
    }
  }
  return pcVar2;
}

Assistant:

static const_iterator
  search(const_iterator first, const_iterator last, const_iterator s_first, const_iterator s_last)
  {
    for (; ; ++first)
    {
      const_iterator it = first;
      for (const_iterator s_it = s_first; ; ++it, ++s_it)
      {
        if (s_it == s_last) { return first; }

        if (it == last) { return last; }

        if (*it != *s_it) { break; }
      }
    }
  }